

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::quadTo(QPainterPath *this,QPointF *c,QPointF *e)

{
  QPointF p;
  QPointF p_00;
  bool bVar1;
  const_reference pEVar2;
  QPointF *in_RDX;
  QPointF *in_RSI;
  long in_FS_OFFSET;
  qreal qVar3;
  qreal qVar4;
  QPointF *c2_00;
  QPointF *e_00;
  QPointF *c1_00;
  double dVar5;
  QPainterPath *this_00;
  Element *elm;
  QPainterPathPrivate *d;
  QPointF c2;
  QPointF c1;
  QPointF prev;
  QPointF *in_stack_ffffffffffffff38;
  QPointF *in_stack_ffffffffffffff40;
  qreal in_stack_ffffffffffffff48;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI->xp;
  local_10 = in_RSI->yp;
  p.yp = in_stack_ffffffffffffff48;
  p.xp = (qreal)in_stack_ffffffffffffff40;
  bVar1 = hasValidCoords(p);
  if (bVar1) {
    local_28 = in_RDX->xp;
    local_20 = in_RDX->yp;
    p_00.yp = in_stack_ffffffffffffff48;
    p_00.xp = (qreal)in_stack_ffffffffffffff40;
    bVar1 = hasValidCoords(p_00);
    if (bVar1) {
      ensureData((QPainterPath *)in_stack_ffffffffffffff40);
      detach((QPainterPath *)in_stack_ffffffffffffff40);
      d_func((QPainterPath *)0x5b7068);
      elementCount((QPainterPath *)in_stack_ffffffffffffff40);
      pEVar2 = QList<QPainterPath::Element>::at
                         ((QList<QPainterPath::Element> *)in_stack_ffffffffffffff40,
                          (qsizetype)in_stack_ffffffffffffff38);
      local_38.xp = -NAN;
      local_38.yp = -NAN;
      QPointF::QPointF(&local_38,pEVar2->x,pEVar2->y);
      bVar1 = ::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if ((!bVar1) ||
         (bVar1 = ::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), !bVar1)) {
        local_48.xp = -NAN;
        local_48.yp = -NAN;
        qVar3 = QPointF::x(&local_38);
        qVar4 = QPointF::x(in_RSI);
        c2_00 = (QPointF *)((qVar4 + qVar4 + qVar3) / 3.0);
        e_00 = (QPointF *)QPointF::y(&local_38);
        qVar3 = QPointF::y(in_RSI);
        QPointF::QPointF(&local_48,(qreal)c2_00,(qVar3 + qVar3 + (double)e_00) / 3.0);
        local_58.xp = -NAN;
        local_58.yp = -NAN;
        c1_00 = (QPointF *)QPointF::x(in_RDX);
        qVar3 = QPointF::x(in_RSI);
        dVar5 = qVar3 + qVar3 + (double)c1_00;
        this_00 = (QPainterPath *)QPointF::y(in_RDX);
        qVar3 = QPointF::y(in_RSI);
        QPointF::QPointF(&local_58,dVar5 / 3.0,(qVar3 + qVar3 + (double)this_00) / 3.0);
        cubicTo(this_00,c1_00,c2_00,e_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainterPath::quadTo(const QPointF &c, const QPointF &e)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::quadTo() (%.2f,%.2f), (%.2f,%.2f)\n",
           c.x(), c.y(), e.x(), e.y());
#endif

    if (!hasValidCoords(c) || !hasValidCoords(e)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::quadTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    Q_D(QPainterPath);
    Q_ASSERT(!d->elements.isEmpty());
    const QPainterPath::Element &elm = d->elements.at(elementCount()-1);
    QPointF prev(elm.x, elm.y);

    // Abort on empty curve as a stroker cannot handle this and the
    // curve is irrelevant anyway.
    if (prev == c && c == e)
        return;

    QPointF c1((prev.x() + 2*c.x()) / 3, (prev.y() + 2*c.y()) / 3);
    QPointF c2((e.x() + 2*c.x()) / 3, (e.y() + 2*c.y()) / 3);
    cubicTo(c1, c2, e);
}